

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O1

void Cmd_test(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  FDoubleProd *prod;
  char *cmd;
  int parsept;
  int local_1c;
  
  local_1c = 1;
  prod = (FDoubleProd *)ParseExpression(argv,&local_1c);
  iVar2 = local_1c;
  if ((prod == (FDoubleProd *)0x0) || (iVar1 = FCommandLine::argc(argv), iVar1 <= iVar2)) {
    Printf("Usage: test <expr> <true cmd> [false cmd]\n");
  }
  else {
    if ((prod->super_FProduction).Type == PROD_String) {
      prod = StringToDouble((FProduction *)prod);
    }
    if ((prod->Value == 0.0) && (!NAN(prod->Value))) {
      iVar1 = local_1c + 1;
      local_1c = iVar1;
      iVar2 = FCommandLine::argc(argv);
      if (iVar2 <= iVar1) goto LAB_0047e7ae;
    }
    cmd = FCommandLine::operator[](argv,local_1c);
    AddCommandString(cmd,0);
  }
LAB_0047e7ae:
  if (prod != (FDoubleProd *)0x0) {
    M_Free(prod);
  }
  return;
}

Assistant:

CCMD (test)
{
	int parsept = 1;
	FProduction *prod = ParseExpression (argv, parsept);

	if (prod == NULL || parsept >= argv.argc())
	{
		Printf ("Usage: test <expr> <true cmd> [false cmd]\n");
	}
	else
	{
		if (prod->Type == PROD_String)
		{
			prod = StringToDouble (prod);
		}

		if (static_cast<FDoubleProd *>(prod)->Value != 0.0)
		{
			AddCommandString (argv[parsept]);
		}
		else if (++parsept < argv.argc())
		{
			AddCommandString (argv[parsept]);
		}
	}
	if (prod != NULL)
	{
		M_Free (prod);
	}
}